

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicRotorWingAircraft.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GED_BasicRotorWingAircraft::Encode
          (GED_BasicRotorWingAircraft *this,KDataStream *stream)

{
  GED_BasicFixedWingAircraft::Encode(&this->super_GED_BasicFixedWingAircraft,stream);
  KDataStream::Write(stream,this->m_i8TrrtAz);
  KDataStream::Write(stream,this->m_i8GnElv);
  KDataStream::Write(stream,this->m_i8TrrtSlwRt);
  KDataStream::Write(stream,this->m_i8GnElvRt);
  return;
}

Assistant:

void GED_BasicRotorWingAircraft::Encode( KDataStream & stream ) const
{
    GED_BasicFixedWingAircraft::Encode( stream );

    stream << m_i8TrrtAz
           << m_i8GnElv
           << m_i8TrrtSlwRt
           << m_i8GnElvRt;
}